

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe24At3(uint8_t *buf)

{
  return (ulong)((uint)(buf[3] >> 5) +
                ((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 0x1f) << 0x10) * 8);
}

Assistant:

std::uint64_t readFlUIntBe24At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 3;
    res |= (buf[3] >> 5);
    res &= UINT64_C(0xffffff);
    return res;
}